

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O1

void dg::llvmdg::LLVMSlicer::adjustPhiNodes(BasicBlock *pred,BasicBlock *blk)

{
  int iVar1;
  int iVar2;
  BasicBlock *pBVar3;
  BasicBlock *pBVar4;
  BasicBlock *this;
  
  pBVar3 = *(BasicBlock **)(pred + 0x30);
  if (pBVar3 != pred + 0x28) {
    do {
      pBVar4 = pBVar3 + -0x18;
      if (pBVar3 == (BasicBlock *)0x0) {
        pBVar4 = (BasicBlock *)0x0;
      }
      this = pBVar4;
      if (pBVar4[0x10] != (BasicBlock)0x52) {
        this = (BasicBlock *)(PHINode *)0x0;
      }
      iVar2 = 2;
      if (pBVar4[0x10] == (BasicBlock)0x52 && pBVar3 != (BasicBlock *)0x0) {
        iVar1 = llvm::PHINode::getBasicBlockIndex((PHINode *)this,blk);
        if (iVar1 < 0) {
          iVar2 = 3;
        }
        else {
          iVar2 = 0;
          llvm::PHINode::removeIncomingValue((uint)this,SUB41(iVar1,0));
        }
      }
    } while (((iVar2 == 3) || (iVar2 == 0)) &&
            (pBVar3 = *(BasicBlock **)(pBVar3 + 8), pBVar3 != pred + 0x28));
  }
  return;
}

Assistant:

static void adjustPhiNodes(llvm::BasicBlock *pred, llvm::BasicBlock *blk) {
        using namespace llvm;

        for (Instruction &I : *pred) {
            PHINode *phi = dyn_cast<PHINode>(&I);
            if (phi) {
                // don't try remove block that we already removed
                int idx = phi->getBasicBlockIndex(blk);
                if (idx < 0)
                    continue;

                // the second argument is DeletePHIIFEmpty.
                // We don't want that, since that would make
                // dependence graph inconsistent. We'll
                // slice it away later, if it's empty
                phi->removeIncomingValue(idx, false);
            } else {
                // phi nodes are always at the beginning of the block
                // so if this is the first value that is not PHI,
                // there won't be any other and we can bail out
                break;
            }
        }
    }